

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo> * __thiscall
TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::operator=
          (TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo> *this,
          TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo> *other)

{
  WeaponInfo *block;
  
  if (other != this) {
    block = this->Array;
    if (block != (WeaponInfo *)0x0) {
      if (this->Count != 0) {
        DoDelete(this,0,this->Count - 1);
        block = this->Array;
      }
      M_Free(block);
    }
    DoCopy(this,other);
  }
  return this;
}

Assistant:

TArray<T,TT> &operator= (const TArray<T,TT> &other)
	{
		if (&other != this)
		{
			if (Array != NULL)
			{
				if (Count > 0)
				{
					DoDelete (0, Count-1);
				}
				M_Free (Array);
			}
			DoCopy (other);
		}
		return *this;
	}